

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Colour.cpp
# Opt level: O3

void __thiscall Colour::~Colour(Colour *this)

{
  pointer pcVar1;
  
  operator_delete(this->colour);
  this->colour = (GLfloat *)0x0;
  pcVar1 = (this->name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->name).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

Colour::~Colour() {
    delete colour;
    colour = nullptr;
}